

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

void __thiscall
cfd::core::JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest>::DeserializeUniValue
          (JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest> *this,UniValue *value)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar3;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  JsonTableMap<cfd::js::api::json::CreateSignatureHashRequest> mapper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  json_map;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>_>
  _Stack_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  local_58;
  
  if (value->typ == VOBJ) {
    (*this->_vptr_JsonClassBase[4])(this);
    iVar2 = (*this->_vptr_JsonClassBase[9])(this);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>_>
    ::_Rb_tree(&_Stack_88,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>_>
                *)CONCAT44(extraout_var_00,iVar2));
    p_Var1 = &local_58._M_impl.super__Rb_tree_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    UniValue::getObjMap((map *)value);
    if ((_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var4 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>_>
                ::find(&_Stack_88,(key_type *)(p_Var4 + 1));
        if ((_Rb_tree_header *)iVar3._M_node != &_Stack_88._M_impl.super__Rb_tree_header) {
          if (iVar3._M_node[3]._M_left == (_Base_ptr)0x0) {
            std::__throw_bad_function_call();
            goto LAB_0062dde8;
          }
          (*(code *)iVar3._M_node[3]._M_right)(iVar3._M_node + 3,this,p_Var4 + 2);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    (*this->_vptr_JsonClassBase[5])(this);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~_Rb_tree(&local_58);
  }
  else {
    if (value->typ != VARR) {
      return;
    }
    iVar2 = (*this->_vptr_JsonClassBase[9])(this);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>_>
    ::_Rb_tree(&_Stack_88,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>_>
                *)CONCAT44(extraout_var,iVar2));
    if (_Stack_88._M_impl.super__Rb_tree_header._M_node_count == 1) {
      (*this->_vptr_JsonClassBase[4])(this);
      if ((_Rb_tree_header *)_Stack_88._M_impl.super__Rb_tree_header._M_header._M_left !=
          &_Stack_88._M_impl.super__Rb_tree_header) {
        if (_Stack_88._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_left == (_Base_ptr)0x0)
        {
LAB_0062dde8:
          uVar5 = std::__throw_bad_function_call();
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>_>
          ::~_Rb_tree(&_Stack_88);
          _Unwind_Resume(uVar5);
        }
        (*(code *)_Stack_88._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_right)
                  (_Stack_88._M_impl.super__Rb_tree_header._M_header._M_left + 3,this,value);
      }
      (*this->_vptr_JsonClassBase[5])(this);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::CreateSignatureHashRequest>_>_>_>
  ::~_Rb_tree(&_Stack_88);
  return;
}

Assistant:

virtual void DeserializeUniValue(const UniValue& value) {
    if (value.isArray()) {
      // If root is one list, take over to child class
      JsonTableMap<TYPE> mapper = GetJsonMapper();
      if (mapper.size() == 1) {
        PreDeserialize();
        auto iter = mapper.begin();
        if (iter != end(mapper)) {
          CLASS_FUNCTION_TABLE<TYPE>* table_info = &iter->second;
          table_info->set_function(*(reinterpret_cast<TYPE*>(this)), value);
        }
        PostDeserialize();
      }
      return;
    } else if (!value.isObject()) {
      return;
    }
    PreDeserialize();
    JsonTableMap<TYPE> mapper = GetJsonMapper();
    std::map<std::string, UniValue> json_map;
    value.getObjMap(json_map);
    for (const auto& child : json_map) {
      auto iter = mapper.find(child.first);
      if (iter != end(mapper)) {
        CLASS_FUNCTION_TABLE<TYPE>* table_info = &iter->second;
        table_info->set_function(
            *(reinterpret_cast<TYPE*>(this)), child.second);
      }
    }
    PostDeserialize();
  }